

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

int __thiscall re2::Prog::ComputeFirstByte(Prog *this)

{
  byte bVar1;
  int iVar2;
  Inst *pIVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  uint uVar7;
  _Head_base<0UL,_int_*,_false> _Var8;
  SparseSet q;
  LogMessage local_1b0;
  
  SparseSetT<void>::SparseSetT(&q,this->size_);
  SparseSetT<void>::insert(&q,this->start_);
  uVar6 = 0xffffffff;
  for (_Var8 = q.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
               super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>;
      _Var8._M_head_impl !=
      q.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
      super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl + q.size_; _Var8._M_head_impl = _Var8._M_head_impl + 1) {
    iVar2 = *_Var8._M_head_impl;
    pIVar3 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
             super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
             super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar7 = pIVar3[iVar2].out_opcode_;
    uVar4 = uVar6;
    switch(uVar7 & 7) {
    case 0:
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                 ,0x272);
      poVar5 = std::operator<<((ostream *)&local_1b0.str_,"unhandled ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pIVar3[iVar2].out_opcode_ & 7);
      std::operator<<(poVar5," in ComputeFirstByte");
      LogMessage::~LogMessage(&local_1b0);
      break;
    case 1:
      uVar7 = iVar2 + 1;
LAB_001a65ce:
      SparseSetT<void>::insert(&q,uVar7);
      break;
    case 2:
      if ((uVar7 & 8) == 0) {
        SparseSetT<void>::insert(&q,iVar2 + 1);
      }
      bVar1 = pIVar3[iVar2].field_1.field_3.lo_;
      if (((bVar1 != pIVar3[iVar2].field_1.field_3.hi_) ||
          (((byte)(bVar1 + 0x9f) < 0x1a && ((pIVar3[iVar2].field_1.field_3.hint_foldcase_ & 1) != 0)
           ))) || ((uVar4 = (uint)bVar1, uVar6 != 0xffffffff && (uVar4 = uVar6, uVar6 != bVar1))))
      goto switchD_001a65a2_caseD_5;
      break;
    default:
      if ((uVar7 & 8) == 0) {
        SparseSetT<void>::insert(&q,iVar2 + 1);
        uVar7 = pIVar3[iVar2].out_opcode_;
      }
      if (0xf < uVar7) {
        uVar7 = uVar7 >> 4;
        goto LAB_001a65ce;
      }
      break;
    case 5:
switchD_001a65a2_caseD_5:
      uVar6 = 0xffffffff;
      goto LAB_001a667c;
    case 7:
      break;
    }
    uVar6 = uVar4;
  }
LAB_001a667c:
  SparseSetT<void>::~SparseSetT(&q);
  return uVar6;
}

Assistant:

int Prog::ComputeFirstByte() {
  int b = -1;
  SparseSet q(size());
  q.insert(start());
  for (SparseSet::iterator it = q.begin(); it != q.end(); ++it) {
    int id = *it;
    Prog::Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled " << ip->opcode() << " in ComputeFirstByte";
        break;

      case kInstMatch:
        // The empty string matches: no first byte.
        return -1;

      case kInstByteRange:
        if (!ip->last())
          q.insert(id+1);

        // Must match only a single byte
        if (ip->lo() != ip->hi())
          return -1;
        if (ip->foldcase() && 'a' <= ip->lo() && ip->lo() <= 'z')
          return -1;
        // If we haven't seen any bytes yet, record it;
        // otherwise must match the one we saw before.
        if (b == -1)
          b = ip->lo();
        else if (b != ip->lo())
          return -1;
        break;

      case kInstNop:
      case kInstCapture:
      case kInstEmptyWidth:
        if (!ip->last())
          q.insert(id+1);

        // Continue on.
        // Ignore ip->empty() flags for kInstEmptyWidth
        // in order to be as conservative as possible
        // (assume all possible empty-width flags are true).
        if (ip->out())
          q.insert(ip->out());
        break;

      case kInstAltMatch:
        DCHECK(!ip->last());
        q.insert(id+1);
        break;

      case kInstFail:
        break;
    }
  }
  return b;
}